

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

cio_error bs_read_at_most_from_buffer_parts
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = frame_buffer_read_pos;
  bVar1 = frame_buffer_read_pos <= frame_buffer_fill_pos;
  if (bVar1) {
    num = num >> (cio_buffered_stream_read_at_most_fake.call_count == 1);
    memcpy(buffer->add_ptr,frame_buffer + frame_buffer_read_pos,num);
    buffer->add_ptr = buffer->add_ptr + num;
    frame_buffer_read_pos = sVar2 + num;
  }
  (*handler)(buffered_stream,handler_context,SUB14(!bVar1,0),buffer,num);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_read_at_most_from_buffer_parts(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (frame_buffer_read_pos > frame_buffer_fill_pos) {
		handler(buffered_stream, handler_context, CIO_EOF, buffer, num);
	} else {
		if (cio_buffered_stream_read_at_most_fake.call_count == 1) {
			num = num / 2;
		}

		memcpy(buffer->add_ptr, &frame_buffer[frame_buffer_read_pos], num);
		buffer->add_ptr += num;
		frame_buffer_read_pos += num;

		handler(buffered_stream, handler_context, CIO_SUCCESS, buffer, num);
	}
	return CIO_SUCCESS;
}